

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int COVER_cmp8(COVER_ctx_t *ctx,void *lp,void *rp)

{
  U64 UVar1;
  U64 UVar2;
  long in_RDI;
  U64 rhs;
  U64 lhs;
  U64 mask;
  void *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x50) == 8) {
    local_40 = 0xffffffffffffffff;
  }
  else {
    local_40 = (1L << ((byte)(*(int *)(in_RDI + 0x50) << 3) & 0x3f)) - 1;
  }
  UVar1 = MEM_readLE64(in_stack_ffffffffffffffb8);
  UVar2 = MEM_readLE64(in_stack_ffffffffffffffb8);
  if ((UVar1 & local_40) < (UVar2 & local_40)) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = (uint)((UVar2 & local_40) < (UVar1 & local_40));
  }
  return local_4;
}

Assistant:

static int COVER_cmp8(COVER_ctx_t *ctx, const void *lp, const void *rp) {
  U64 const mask = (ctx->d == 8) ? (U64)-1 : (((U64)1 << (8 * ctx->d)) - 1);
  U64 const lhs = MEM_readLE64(ctx->samples + *(U32 const *)lp) & mask;
  U64 const rhs = MEM_readLE64(ctx->samples + *(U32 const *)rp) & mask;
  if (lhs < rhs) {
    return -1;
  }
  return (lhs > rhs);
}